

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

Text __thiscall loguru::get_error_context_for(loguru *this,EcEntryBase *ec_head)

{
  EcEntryBase *pEVar1;
  pointer ppEVar2;
  char *pcVar3;
  pointer ppEVar4;
  allocator<char> local_b9;
  vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> stack;
  EcEntryBase *ec_head_local;
  loguru *local_98;
  StringStream result;
  Text prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  
  stack.
  super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (ec_head_local = ec_head; ec_head_local != (EcEntryBase *)0x0;
      ec_head_local = ec_head_local->_previous) {
    std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::
    push_back(&stack,&ec_head_local);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<loguru::EcEntryBase_const**,std::vector<loguru::EcEntryBase_const*,std::allocator<loguru::EcEntryBase_const*>>>>
            (stack.
             super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             stack.
             super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  result.str._M_dataplus._M_p = (pointer)&result.str.field_2;
  result.str._M_string_length = 0;
  result.str.field_2._M_local_buf[0] = '\0';
  if (stack.
      super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      stack.
      super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_98 = this;
    std::__cxx11::string::append((char *)&result);
    ppEVar2 = stack.
              super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar4 = stack.
                   super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar4 != ppEVar2;
        ppEVar4 = ppEVar4 + 1) {
      pEVar1 = *ppEVar4;
      std::__cxx11::string::string<std::allocator<char>>((string *)&prefix,pEVar1->_descr,&local_b9)
      ;
      std::operator+(&description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix,
                     ":");
      std::__cxx11::string::~string((string *)&prefix);
      pcVar3 = filename(pEVar1->_file);
      textprintf((loguru *)&prefix,"[ErrorContext] %*s:%-5u %-20s ",0x17,pcVar3,(ulong)pEVar1->_line
                 ,description._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&result);
      (**pEVar1->_vptr_EcEntryBase)(pEVar1,&result);
      std::__cxx11::string::append((char *)&result);
      free(prefix._str);
      std::__cxx11::string::~string((string *)&description);
    }
    std::__cxx11::string::append((char *)&result);
    this = local_98;
  }
  pcVar3 = strdup(result.str._M_dataplus._M_p);
  *(char **)this = pcVar3;
  std::__cxx11::string::~string((string *)&result);
  std::_Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::
  ~_Vector_base(&stack.
                 super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
               );
  return (Text)(char *)this;
}

Assistant:

Text get_error_context_for(const EcEntryBase* ec_head)
	{
		std::vector<const EcEntryBase*> stack;
		while (ec_head) {
			stack.push_back(ec_head);
			ec_head = ec_head->_previous;
		}
		std::reverse(stack.begin(), stack.end());

		StringStream result;
		if (!stack.empty()) {
			result.str += "------------------------------------------------\n";
			for (auto entry : stack) {
				const auto description = std::string(entry->_descr) + ":";
				auto prefix = textprintf("[ErrorContext] %*s:%-5u %-20s ",
					LOGURU_FILENAME_WIDTH, filename(entry->_file), entry->_line, description.c_str());
				result.str += prefix.c_str();
				entry->print_value(result);
				result.str += "\n";
			}
			result.str += "------------------------------------------------";
		}
		return Text(STRDUP(result.str.c_str()));
	}